

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O1

char * Tobjnam(obj *otmp,char *verb)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  char *__src;
  
  pcVar2 = xname2(otmp,'\0');
  pcVar2 = the(pcVar2);
  cVar1 = highc(*pcVar2);
  *pcVar2 = cVar1;
  if (verb != (char *)0x0) {
    sVar3 = strlen(pcVar2);
    (pcVar2 + sVar3)[0] = ' ';
    (pcVar2 + sVar3)[1] = '\0';
    __src = otense(otmp,verb);
    pcVar2 = strcat(pcVar2,__src);
    return pcVar2;
  }
  return pcVar2;
}

Assistant:

char *Tobjnam(const struct obj *otmp, const char *verb)
{
	char *bp = The(xname(otmp));

	if (verb) {
	    strcat(bp, " ");
	    strcat(bp, otense(otmp, verb));
	}
	return bp;
}